

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall sf::Image::create(Image *this,uint width,uint height,Color *color)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (height == 0 || width == 0) {
    puVar3 = (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    (this->m_size).x = 0;
    (this->m_size).y = 0;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_48,(ulong)(width * height * 4),&local_49);
    for (puVar3 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
        puVar3 < local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish; puVar3 = puVar3 + 4) {
      *puVar3 = color->r;
      puVar3[1] = color->g;
      puVar3[2] = color->b;
      puVar3[3] = color->a;
    }
    puVar3 = (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->m_size).x = width;
    (this->m_size).y = height;
    if (puVar3 != (pointer)0x0) {
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar3;
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar2;
      operator_delete(puVar3);
    }
  }
  return;
}

Assistant:

void Image::create(unsigned int width, unsigned int height, const Color& color)
{
    if (width && height)
    {
        // Create a new pixel buffer first for exception safety's sake
        std::vector<Uint8> newPixels(width * height * 4);
    
        // Fill it with the specified color
        Uint8* ptr = &newPixels[0];
        Uint8* end = ptr + newPixels.size();
        while (ptr < end)
        {
            *ptr++ = color.r;
            *ptr++ = color.g;
            *ptr++ = color.b;
            *ptr++ = color.a;
        }
    
        // Commit the new pixel buffer
        m_pixels.swap(newPixels);
        
        // Assign the new size
        m_size.x = width;
        m_size.y = height;
    }
    else
    {
        // Dump the pixel buffer
        std::vector<Uint8>().swap(m_pixels);
        
        // Assign the new size
        m_size.x = 0;
        m_size.y = 0;
    }
}